

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetBrDropKeepCount
          (BinaryReaderInterp *this,Index depth,Index *out_drop_count,Index *out_keep_count)

{
  bool bVar1;
  Result RVar2;
  TypeVector *this_00;
  size_type sVar3;
  Index keep_count;
  Label *label;
  Index *out_keep_count_local;
  Index *out_drop_count_local;
  BinaryReaderInterp *pBStack_18;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  label = (Label *)out_keep_count;
  out_keep_count_local = out_drop_count;
  out_drop_count_local._4_4_ = depth;
  pBStack_18 = this;
  RVar2 = SharedValidator::GetLabel(&this->validator_,depth,(Label **)&keep_count);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = TypeChecker::Label::br_types(_keep_count);
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(this_00);
    RVar2 = GetDropCount(this,(LabelType)sVar3,_keep_count->type_stack_limit,out_keep_count_local);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      label->label_type = (LabelType)sVar3;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::GetBrDropKeepCount(Index depth,
                                              Index* out_drop_count,
                                              Index* out_keep_count) {
  SharedValidator::Label* label;
  CHECK_RESULT(validator_.GetLabel(depth, &label));
  Index keep_count = label->br_types().size();
  CHECK_RESULT(
      GetDropCount(keep_count, label->type_stack_limit, out_drop_count));
  *out_keep_count = keep_count;
  return Result::Ok;
}